

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * commify(string *__return_storage_ptr__,string *data)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  int local_64;
  int i_2;
  int local_58;
  int consecutiveDigits_1;
  int consecutiveDigits;
  string local_48 [8];
  string result;
  int i_1;
  int i;
  int end;
  int decimalPoint;
  string *data_local;
  string *done;
  
  i = -1;
  i_1 = -1;
  for (result.field_2._8_4_ = 0; uVar1 = result.field_2._8_4_,
      iVar2 = std::__cxx11::string::length(), (int)uVar1 < iVar2;
      result.field_2._8_4_ = result.field_2._8_4_ + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
    iVar2 = isdigit((int)*pcVar3);
    if (iVar2 != 0) {
      i_1 = result.field_2._8_4_;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
    if (*pcVar3 == '.') {
      i = result.field_2._8_4_;
    }
  }
  std::__cxx11::string::string(local_48);
  if (i == -1) {
    result.field_2._12_4_ = std::__cxx11::string::length();
    while (result.field_2._12_4_ = result.field_2._12_4_ + -1, i_1 < (int)result.field_2._12_4_) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
      std::__cxx11::string::operator+=(local_48,*pcVar3);
    }
    i_2 = 0;
    for (; -1 < (int)result.field_2._12_4_; result.field_2._12_4_ = result.field_2._12_4_ + -1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
      iVar2 = isdigit((int)*pcVar3);
      if (iVar2 == 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::operator+=(local_48,*pcVar3);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::operator+=(local_48,*pcVar3);
        i_2 = i_2 + 1;
        if ((i_2 == 3) && (result.field_2._12_4_ != 0)) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
          iVar2 = isdigit((int)*pcVar3);
          if (iVar2 != 0) {
            std::__cxx11::string::operator+=(local_48,',');
            i_2 = 0;
          }
        }
      }
    }
  }
  else {
    result.field_2._12_4_ = std::__cxx11::string::length();
    while (result.field_2._12_4_ = result.field_2._12_4_ + -1, i <= (int)result.field_2._12_4_) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
      std::__cxx11::string::operator+=(local_48,*pcVar3);
    }
    local_58 = 0;
    for (; -1 < (int)result.field_2._12_4_; result.field_2._12_4_ = result.field_2._12_4_ + -1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
      iVar2 = isdigit((int)*pcVar3);
      if (iVar2 == 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::operator+=(local_48,*pcVar3);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
        std::__cxx11::string::operator+=(local_48,*pcVar3);
        local_58 = local_58 + 1;
        if ((local_58 == 3) && (result.field_2._12_4_ != 0)) {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)data);
          iVar2 = isdigit((int)*pcVar3);
          if (iVar2 != 0) {
            std::__cxx11::string::operator+=(local_48,',');
            local_58 = 0;
          }
        }
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_64 = std::__cxx11::string::length();
  while (local_64 = local_64 + -1, -1 < local_64) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
  }
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string commify (const std::string& data)
{
  // First scan for decimal point and end of digits.
  int decimalPoint = -1;
  int end          = -1;

  int i;
  for (int i = 0; i < (int) data.length (); ++i)
  {
    if (isdigit (data[i]))
      end = i;

    if (data[i] == '.')
      decimalPoint = i;
  }

  std::string result;
  if (decimalPoint != -1)
  {
    // In reverse order, transfer all digits up to, and including the decimal
    // point.
    for (i = (int) data.length () - 1; i >= decimalPoint; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }
  else
  {
    // In reverse order, transfer all digits up to, but not including the last
    // digit.
    for (i = (int) data.length () - 1; i > end; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }

  // reverse result into data.
  std::string done;
  for (int i = (int) result.length () - 1; i >= 0; --i)
    done += result[i];

  return done;
}